

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Internal_DecrementCurrentPosition(ON_BinaryArchive *this,ON__UINT64 delta)

{
  bool bVar1;
  ON__UINT64 new_pos;
  ON__UINT64 delta_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = this->m_current_positionX < delta;
  if (bVar1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2d0,"","Attempt to set current position before start of archive.");
  }
  else {
    this->m_current_positionX = this->m_current_positionX - delta;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Internal_DecrementCurrentPosition(
  ON__UINT64 delta
)
{
  if (m_current_positionX >= delta)
  {
    const ON__UINT64 new_pos = m_current_positionX - delta;
    m_current_positionX = new_pos;
    return true;
  }

  ON_ERROR("Attempt to set current position before start of archive.");

  return false;
}